

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_gen_nim.cpp
# Opt level: O2

void __thiscall
flatbuffers::anon_unknown_0::NimBfbsGenerator::GenerateDocumentation
          (NimBfbsGenerator *this,
          Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *documentation,
          string *indent,string *code)

{
  uint *puVar1;
  uint8_t *offset_location;
  uint *puVar2;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  local_28 = std::
             _Function_handler<void_(const_flatbuffers::String_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/bfbs_gen_nim.cpp:355:24)>
             ::_M_invoke;
  local_30 = std::
             _Function_handler<void_(const_flatbuffers::String_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/bfbs_gen_nim.cpp:355:24)>
             ::_M_manager;
  local_40._M_unused._M_object = indent;
  local_40._8_8_ = documentation;
  if (this != (NimBfbsGenerator *)0x0) {
    puVar1 = (uint *)((long)&(this->super_BaseBfbsGenerator).super_CodeGenerator._vptr_CodeGenerator
                     + 4);
    for (puVar2 = puVar1;
        puVar2 != (uint *)((ulong)(uint)(*(int *)&(this->super_BaseBfbsGenerator).
                                                  super_CodeGenerator._vptr_CodeGenerator << 2) +
                          (long)puVar1); puVar2 = puVar2 + 1) {
      std::function<void_(const_flatbuffers::String_*)>::operator()
                ((function<void_(const_flatbuffers::String_*)> *)&local_40,
                 (String *)((ulong)*puVar2 + (long)puVar2));
    }
  }
  std::_Function_base::~_Function_base((_Function_base *)&local_40);
  return;
}

Assistant:

bool SupportsBfbsGeneration() const override { return true; }